

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,Header *aHeader,ByteArray *aBuf)

{
  byte bVar1;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  bool bVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_150;
  const_iterator local_148;
  value_type_conflict1 local_13e;
  value_type_conflict1 local_13d;
  byte local_13c [2];
  anon_class_1_0_00000001 local_13a;
  v10 local_139;
  v10 *local_138;
  size_t local_130;
  string local_128;
  Error local_108;
  undefined1 local_c9;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_c8;
  ByteArray *aBuf_local;
  Header *aHeader_local;
  Message *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  local_c9 = 0;
  local_c8 = (vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf;
  aBuf_local = (ByteArray *)aHeader;
  aHeader_local = &this->mHeader;
  this_local = (Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  bVar2 = Header::IsValid((Header *)aBuf_local);
  if (bVar2) {
    bVar1 = *(byte *)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    local_13c[0] = bVar1 << 6 | (bVar1 >> 2 & 3) << 4 | bVar1 >> 4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,local_13c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
               (value_type_conflict1 *)
               ((long)&(aBuf_local->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1));
    local_13d = *(value_type_conflict1 *)
                 ((long)&(aBuf_local->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start + 3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,&local_13d);
    local_13e = *(value_type_conflict1 *)
                 ((long)&(aBuf_local->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start + 2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,&local_13e);
    this_00 = local_c8;
    local_150._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_148,&local_150);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              (this_00,local_148,
               (uchar *)((long)&(aBuf_local->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start + 4),
               (uchar *)((long)&(aBuf_local->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start +
                        (ulong)(*(byte *)&(aBuf_local->
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 4) + 4));
  }
  else {
    Serialize::anon_class_1_0_00000001::operator()(&local_13a);
    local_58 = &local_138;
    local_60 = &local_139;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_130 = bVar3.size_;
    local_138 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_128;
    local_78 = local_138;
    sStack_70 = local_130;
    local_50 = &local_78;
    local_88 = local_138;
    local_80 = local_130;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_128,local_88,fmt,args);
    Error::Error(&local_108,kInvalidArgs,&local_128);
    Error::operator=(__return_storage_ptr__,&local_108);
    Error::~Error(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Serialize(const Header &aHeader, ByteArray &aBuf) const
{
    Error error;

    VerifyOrExit(aHeader.IsValid(), error = ERROR_INVALID_ARGS("serialize an invalid CoAP message header"));

    aBuf.push_back((aHeader.mVersion << 6) | (aHeader.mType << 4) | aHeader.mTokenLength);
    aBuf.push_back(aHeader.mCode);
    aBuf.push_back((aHeader.mMessageId & 0xff00) >> 8);
    aBuf.push_back((aHeader.mMessageId & 0x00ff));
    aBuf.insert(aBuf.end(), aHeader.mToken, aHeader.mToken + aHeader.mTokenLength);

exit:
    return error;
}